

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

LiteralString * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                  *args_2,TokenKind *args_3,char (*args_4) [1],char (*args_5) [1])

{
  TokenKind token_kind;
  LiteralString *this_00;
  allocator<char> local_7a;
  allocator<char> local_79;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_78;
  string local_70;
  string local_50;
  
  local_78 = args_2;
  this_00 = (LiteralString *)operator_new(0xe8);
  token_kind = *args_3;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,*args_4,&local_79);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*args_5,&local_7a);
  LiteralString::LiteralString(this_00,args,args_1,local_78,token_kind,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  local_70._M_dataplus._M_p = (pointer)this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,(value_type *)&local_70);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }